

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.cpp
# Opt level: O2

int __thiscall
OpenSSLWrapper::SslConnection::ShutDownConnection(SslConnection *this,int *iErrorHint)

{
  int iVar1;
  runtime_error *this_00;
  SslConnection *this_01;
  undefined1 local_120 [32];
  _Any_data local_100 [2];
  wstring local_e0;
  wstring local_c0;
  wstring local_a0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_80;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_60;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_40;
  
  if (this->m_ssl != (SSL *)0x0) {
    iVar1 = this->m_iShutDownFlag;
    if (iVar1 < 1) {
      std::mutex::lock(&this->m_mxSsl);
      iVar1 = SSL_shutdown((SSL *)this->m_ssl);
      this->m_iShutDownFlag = iVar1;
      if (iVar1 < 0) {
        iVar1 = SSL_get_error((SSL *)this->m_ssl,iVar1);
        if (iErrorHint != (int *)0x0) {
          *iErrorHint = iVar1;
        }
        if (iVar1 != 2) {
          std::__cxx11::to_wstring(&local_a0,this->m_iShutDownFlag);
          std::operator+(&local_80,L"SSL_shutdown code: ",&local_a0);
          std::operator+(&local_60,&local_80,L" Error-Code: ");
          std::__cxx11::to_wstring(&local_c0,iVar1);
          std::operator+(&local_40,&local_60,&local_c0);
          std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                          *)local_120,&local_40,L" on ssl context: ");
          std::__cxx11::to_wstring((wstring *)(local_120 + 0x40),(unsigned_long)this->m_ssl);
          this_01 = (SslConnection *)local_120;
          std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                          *)(local_120 + 0x20),
                         (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                          *)this_01,
                         (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                          *)(local_120 + 0x40));
          OutputDebugString((wchar_t *)local_100[0]._0_8_);
          std::__cxx11::wstring::~wstring((wstring *)(local_120 + 0x20));
          std::__cxx11::wstring::~wstring((wstring *)(local_120 + 0x40));
          std::__cxx11::wstring::~wstring((wstring *)local_120);
          std::__cxx11::wstring::~wstring((wstring *)&local_40);
          std::__cxx11::wstring::~wstring((wstring *)&local_c0);
          std::__cxx11::wstring::~wstring((wstring *)&local_60);
          std::__cxx11::wstring::~wstring((wstring *)&local_80);
          std::__cxx11::wstring::~wstring((wstring *)&local_a0);
          GetSslErrAsString_abi_cxx11_((string *)local_120,this_01);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_120 + 0x20),", msg: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_120);
          OutputDebugStringA((char *)local_100[0]._0_8_);
          std::__cxx11::string::~string((string *)(local_120 + 0x20));
          std::__cxx11::string::~string((string *)local_120);
        }
      }
      pthread_mutex_unlock((pthread_mutex_t *)&this->m_mxSsl);
      iVar1 = this->m_iShutDownFlag;
    }
    return iVar1;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Not Initialized");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int SslConnection::ShutDownConnection(int* iErrorHint/* = nullptr*/)
    {
        if (nullptr == m_ssl)
            throw runtime_error("Not Initialized");

        if (m_iShutDownFlag < 1)
        {
            lock_guard<mutex> lk(m_mxSsl);

            m_iShutDownFlag = SSL_shutdown(m_ssl);
            if (m_iShutDownFlag < 0)
            {
                int iError = SSL_get_error(m_ssl, m_iShutDownFlag);
                if (iErrorHint != nullptr)
                    *iErrorHint = iError;
                if (iError != SSL_ERROR_WANT_READ)
                {
                    OutputDebugString(wstring(L"SSL_shutdown code: " + to_wstring(m_iShutDownFlag) + L" Error-Code: " + to_wstring(iError) + L" on ssl context: " + to_wstring(reinterpret_cast<size_t>(m_ssl))).c_str());
                    OutputDebugStringA(string(", msg: " + GetSslErrAsString()).c_str());
                }
            }
        }
        return m_iShutDownFlag;
    }